

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_client.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *addr;
  int iVar1;
  simple_client local_60;
  
  if (argc == 3) {
    addr = argv[1];
    iVar1 = atoi(argv[2]);
    simple_client::simple_client(&local_60,addr,iVar1);
    iVar1 = simple_client::run(&local_60);
    ranger::event::tcp_connection::~tcp_connection(&local_60.m_conn);
    ranger::event::dispatcher::~dispatcher(&local_60.m_disp);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage: simple_client <address> <port>",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 3) {
		std::cerr << "Usage: simple_client <address> <port>" << std::endl;
		return -1;
	}

	return simple_client(argv[1], atoi(argv[2])).run();
}